

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<unsigned_char,_8UL>::reserve
          (ArrayWithPreallocation<unsigned_char,_8UL> *this,size_t minSize)

{
  ulong uVar1;
  size_t sVar2;
  uchar *puVar3;
  uchar *puVar4;
  size_t sVar5;
  ulong uVar6;
  
  uVar1 = this->numAllocated;
  if (uVar1 < minSize) {
    uVar6 = minSize + 0xf & 0xfffffffffffffff0;
    if (uVar6 != 0) {
      puVar4 = (uchar *)operator_new__(uVar6);
      sVar2 = this->numActive;
      if (sVar2 != 0) {
        puVar3 = this->items;
        sVar5 = 0;
        do {
          puVar4[sVar5] = puVar3[sVar5];
          sVar5 = sVar5 + 1;
        } while (sVar2 != sVar5);
      }
      if ((8 < uVar1) && (this->items != (uchar *)0x0)) {
        operator_delete__(this->items);
      }
      this->items = puVar4;
    }
    this->numAllocated = uVar6;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }